

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary.cpp
# Opt level: O2

double __thiscall ary::BinaryPattern::match(BinaryPattern *this,Mat *src,int *orientation)

{
  vector<cv::Mat,_std::allocator<cv::Mat>_> *this_00;
  _InputArray *p_Var1;
  ulong __n;
  double dVar2;
  double dVar3;
  double dVar4;
  double local_1c0;
  _InputArray local_1b8;
  _InputArray local_198;
  _OutputArray local_180;
  double local_168;
  int *local_150;
  double local_148;
  undefined8 uStack_140;
  double local_138;
  double dStack_130;
  double local_128;
  Scalar mean_int;
  Scalar mean_ext;
  Mat interior;
  Scalar std_int;
  Scalar std_ext;
  
  local_150 = orientation;
  cv::Scalar_<double>::Scalar_(&mean_ext);
  cv::Scalar_<double>::Scalar_(&std_ext);
  cv::Scalar_<double>::Scalar_((Scalar_<double> *)&mean_int);
  cv::Scalar_<double>::Scalar_(&std_int);
  cv::Mat::operator()(&interior,src,(Range)0x4b00000019,(Range)0x4b00000019);
  local_1b8.sz.width = 0;
  local_1b8.sz.height = 0;
  local_1b8.flags = 0x1010000;
  local_198.flags = -0x3dfdfffa;
  local_198.sz.width = 1;
  local_198.sz.height = 4;
  local_180.super__InputArray.flags = -0x3dfdfffa;
  local_180.super__InputArray.sz.width = 1;
  local_180.super__InputArray.sz.height = 4;
  local_1b8.obj = src;
  local_198.obj = &mean_ext;
  local_180.super__InputArray.obj = &std_ext;
  p_Var1 = (_InputArray *)cv::noArray();
  cv::meanStdDev(&local_1b8,(_OutputArray *)&local_198,&local_180,p_Var1);
  local_1b8.sz.width = 0;
  local_1b8.sz.height = 0;
  local_1b8.flags = 0x1010000;
  local_198.flags = -0x3dfdfffa;
  local_198.sz.width = 1;
  local_198.sz.height = 4;
  local_180.super__InputArray.flags = -0x3dfdfffa;
  local_180.super__InputArray.sz.width = 1;
  local_180.super__InputArray.sz.height = 4;
  local_1b8.obj = &interior;
  local_198.obj = (reference)&mean_int;
  local_180.super__InputArray.obj = &std_int;
  p_Var1 = (_InputArray *)cv::noArray();
  cv::meanStdDev(&local_1b8,(_OutputArray *)&local_198,&local_180,p_Var1);
  if (mean_ext.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] <=
      mean_int.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0]) {
    local_1b8.sz.width = 0;
    local_1b8.sz.height = 0;
    local_1b8.flags = 0x1010000;
    local_1b8.obj = &interior;
    p_Var1 = (_InputArray *)cv::noArray();
    local_128 = (double)cv::norm(&local_1b8,4,p_Var1);
    local_128 = local_128 * local_128;
    this_00 = &this->markers;
    local_1c0 = -1.0;
    for (__n = 0; __n < (ulong)(((long)(this->markers).
                                       super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl
                                       .super__Vector_impl_data._M_finish -
                                (long)(this->markers).
                                      super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                                      super__Vector_impl_data._M_start) / 0x60); __n = __n + 1) {
      local_1b8.obj = std::vector<cv::Mat,_std::allocator<cv::Mat>_>::at(this_00,__n);
      local_1b8.sz.width = 0;
      local_1b8.sz.height = 0;
      local_1b8.flags = 0x1010000;
      p_Var1 = (_InputArray *)cv::noArray();
      local_168 = (double)cv::norm(&local_1b8,4,p_Var1);
      local_198.obj = std::vector<cv::Mat,_std::allocator<cv::Mat>_>::at(this_00,__n);
      local_198.sz.width = 0;
      local_198.sz.height = 0;
      local_198.flags = 0x1010000;
      cv::noArray();
      cv::mean(&local_1b8,&local_198);
      local_148 = (double)CONCAT44(local_1b8._4_4_,local_1b8.flags);
      uStack_140 = 0;
      local_1b8.obj = std::vector<cv::Mat,_std::allocator<cv::Mat>_>::at(this_00,__n);
      local_1b8.sz.width = 0;
      local_1b8.sz.height = 0;
      local_1b8.flags = 0x1010000;
      dVar2 = (double)cv::Mat::dot((_InputArray *)&interior);
      dVar4 = mean_int.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] * -2500.0;
      dVar3 = (mean_int.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] * dVar4 + local_128) *
              (local_148 * local_148 * -2500.0 + local_168 * local_168);
      if (dVar3 < 0.0) {
        local_168 = dVar2;
        local_138 = local_148 * -2500.0;
        dStack_130 = dVar4;
        dVar3 = sqrt(dVar3);
        dVar2 = local_168;
        dVar4 = dStack_130;
      }
      else {
        dVar3 = SQRT(dVar3);
      }
      dVar3 = (dVar4 * local_148 + dVar2) / dVar3;
      if (local_1c0 < dVar3) {
        *local_150 = (int)__n;
        local_1c0 = dVar3;
      }
    }
  }
  else {
    local_1c0 = -1.0;
  }
  cv::Mat::~Mat(&interior);
  return local_1c0;
}

Assistant:

double BinaryPattern::match(const Mat& src, int& orientation) {

	int i;
	double tempsim;
	double N = (double)(PATTERN_SIZE * PATTERN_SIZE / 4);
	double nom, den;

	Scalar mean_ext, std_ext, mean_int, std_int;

	Mat interior = src(cv::Range(PATTERN_SIZE / 4, 3 * PATTERN_SIZE / 4), cv::Range(PATTERN_SIZE / 4, 3 * PATTERN_SIZE / 4));

	meanStdDev(src, mean_ext, std_ext);
	meanStdDev(interior, mean_int, std_int);

	//printf("ext: %f int: %f \n", mean_ext.val[0], mean_int.val[0]);

	if ((mean_ext.val[0] > mean_int.val[0]))
		return -1;

	double normSrcSq = pow(norm(interior), 2);

	//zero_mean_mode;
	int zero_mean_mode = 1;

	//use correlation coefficient as a robust similarity measure
	double confidence = -1.0;
	for (i = 0; i < markers.size(); i++) {

		double const nnn = pow(norm(markers.at(i)), 2);

		if (zero_mean_mode == 1) {

			double const mmm = mean(markers.at(i)).val[0];

			nom = interior.dot(markers.at(i)) - (N * mean_int.val[0] * mmm);
			den = sqrt( (normSrcSq - (N * mean_int.val[0] * mean_int.val[0]) ) * (nnn - (N * mmm * mmm)));
			tempsim = nom / den;
		}
		else
		{
			tempsim = interior.dot(markers.at(i)) / (sqrt(normSrcSq * nnn));
		}

		if (tempsim > confidence) {
			confidence = tempsim;
			orientation = i;
		}
	}

	return confidence;
}